

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  unsigned_short uVar1;
  stbrp_coord sVar2;
  ushort uVar3;
  int iVar4;
  ImFontAtlasCustomRect *pIVar5;
  stbrp_rect *psVar6;
  bool bVar7;
  int local_4c;
  int local_48;
  int i_1;
  int i;
  undefined1 local_38 [8];
  ImVector<stbrp_rect> pack_rects;
  ImVector<ImFontAtlasCustomRect> *user_rects;
  stbrp_context *pack_context;
  void *stbrp_context_opaque_local;
  ImFontAtlas *atlas_local;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x84a,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  pack_rects.Data = (stbrp_rect *)&atlas->CustomRects;
  if (0 < ((ImVector<ImFontAtlasCustomRect> *)pack_rects.Data)->Size) {
    ImVector<stbrp_rect>::ImVector((ImVector<stbrp_rect> *)local_38);
    ImVector<stbrp_rect>::resize((ImVector<stbrp_rect> *)local_38,(pack_rects.Data)->id);
    iVar4 = ImVector<stbrp_rect>::size_in_bytes((ImVector<stbrp_rect> *)local_38);
    memset((void *)pack_rects._0_8_,0,(long)iVar4);
    for (local_48 = 0; local_48 < (pack_rects.Data)->id; local_48 = local_48 + 1) {
      pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                         ((ImVector<ImFontAtlasCustomRect> *)pack_rects.Data,local_48);
      uVar1 = pIVar5->Width;
      psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_48);
      psVar6->w = uVar1;
      pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                         ((ImVector<ImFontAtlasCustomRect> *)pack_rects.Data,local_48);
      uVar1 = pIVar5->Height;
      psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_48);
      psVar6->h = uVar1;
    }
    psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,0);
    stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psVar6,local_38._0_4_);
    local_4c = 0;
    do {
      if ((int)local_38._0_4_ <= local_4c) {
        ImVector<stbrp_rect>::~ImVector((ImVector<stbrp_rect> *)local_38);
        return;
      }
      psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
      if (psVar6->was_packed != 0) {
        psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
        sVar2 = psVar6->x;
        pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                           ((ImVector<ImFontAtlasCustomRect> *)pack_rects.Data,local_4c);
        pIVar5->X = sVar2;
        psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
        sVar2 = psVar6->y;
        pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                           ((ImVector<ImFontAtlasCustomRect> *)pack_rects.Data,local_4c);
        pIVar5->Y = sVar2;
        psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
        sVar2 = psVar6->w;
        pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                           ((ImVector<ImFontAtlasCustomRect> *)pack_rects.Data,local_4c);
        bVar7 = false;
        if (sVar2 == pIVar5->Width) {
          psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
          sVar2 = psVar6->h;
          pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[]
                             ((ImVector<ImFontAtlasCustomRect> *)pack_rects.Data,local_4c);
          bVar7 = sVar2 == pIVar5->Height;
        }
        if (!bVar7) {
          __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                        ,0x85d,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
        }
        iVar4 = atlas->TexHeight;
        psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
        uVar3 = psVar6->y;
        psVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
        iVar4 = ImMax<int>(iVar4,(uint)uVar3 + (uint)psVar6->h);
        atlas->TexHeight = iVar4;
      }
      local_4c = local_4c + 1;
    } while( true );
  }
  __assert_fail("user_rects.Size >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                ,0x84d,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}